

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_MQTT_Common_SetOption(TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  char *copied_proxy_password;
  char *copied_proxy_username;
  char *copied_proxy_hostname;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  HTTP_PROXY_OPTIONS *proxy_options;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  int *keepAliveOption;
  int *connection_time;
  PMQTTTRANSPORT_HANDLE_DATA pMStack_38;
  IOTHUB_CREDENTIAL_TYPE cred_type;
  MQTTTRANSPORT_HANDLE_DATA *transport_data;
  LOGGER_LOG l;
  LOGGER_LOG p_Stack_20;
  IOTHUB_CLIENT_RESULT result;
  void *value_local;
  char *option_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  p_Stack_20 = (LOGGER_LOG)value;
  value_local = option;
  option_local = (char *)handle;
  if (((handle == (TRANSPORT_LL_HANDLE)0x0) || (option == (char *)0x0)) || (value == (void *)0x0)) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    transport_data = (MQTTTRANSPORT_HANDLE_DATA *)xlogging_get_log_function();
    if (transport_data != (MQTTTRANSPORT_HANDLE_DATA *)0x0) {
      (*(code *)transport_data)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"IoTHubTransport_MQTT_Common_SetOption",0xe9e,1,
                 "invalid parameter (NULL) passed to IoTHubTransport_MQTT_Common_SetOption.");
    }
  }
  else {
    pMStack_38 = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    connection_time._4_4_ =
         IoTHubClient_Auth_Get_Credential_Type
                   (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
    iVar1 = strcmp(OPTION_LOG_TRACE,(char *)value_local);
    if (iVar1 == 0) {
      pMStack_38->log_trace = (_Bool)((byte)*p_Stack_20 & 1);
      mqtt_client_set_trace
                (pMStack_38->mqttClient,(_Bool)(pMStack_38->log_trace & 1),
                 (_Bool)(pMStack_38->raw_trace & 1));
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      iVar1 = strcmp("rawlogtrace",(char *)value_local);
      if (iVar1 == 0) {
        pMStack_38->raw_trace = (_Bool)((byte)*p_Stack_20 & 1);
        mqtt_client_set_trace
                  (pMStack_38->mqttClient,(_Bool)(pMStack_38->log_trace & 1),
                   (_Bool)(pMStack_38->raw_trace & 1));
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        iVar1 = strcmp(OPTION_AUTO_URL_ENCODE_DECODE,(char *)value_local);
        if (iVar1 == 0) {
          pMStack_38->auto_url_encode_decode = (_Bool)((byte)*p_Stack_20 & 1);
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          iVar1 = strcmp(OPTION_CONNECTION_TIMEOUT,(char *)value_local);
          if (iVar1 == 0) {
            if (*(uint *)p_Stack_20 != (uint)pMStack_38->connect_timeout_in_sec) {
              pMStack_38->connect_timeout_in_sec = (uint16_t)*(uint *)p_Stack_20;
            }
            l._4_4_ = IOTHUB_CLIENT_OK;
          }
          else {
            iVar1 = strcmp(OPTION_KEEP_ALIVE,(char *)value_local);
            if (iVar1 == 0) {
              l_1 = p_Stack_20;
              if ((*(uint *)p_Stack_20 != (uint)pMStack_38->keepAliveValue) &&
                 (pMStack_38->keepAliveValue = (uint16_t)*(uint *)p_Stack_20,
                 pMStack_38->mqttClientStatus != MQTT_CLIENT_STATUS_NOT_CONNECTED)) {
                DisconnectFromClient(pMStack_38);
              }
              l._4_4_ = IOTHUB_CLIENT_OK;
            }
            else {
              iVar1 = strcmp(OPTION_X509_CERT,(char *)value_local);
              if (((iVar1 == 0) && (connection_time._4_4_ != IOTHUB_CREDENTIAL_TYPE_X509)) &&
                 (connection_time._4_4_ != IOTHUB_CREDENTIAL_TYPE_UNKNOWN)) {
                l_2 = xlogging_get_log_function();
                if (l_2 != (LOGGER_LOG)0x0) {
                  (*l_2)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"IoTHubTransport_MQTT_Common_SetOption",0xecf,1,
                         "x509certificate specified, but authentication method is not x509");
                }
                l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
              }
              else {
                iVar1 = strcmp(OPTION_X509_PRIVATE_KEY,(char *)value_local);
                if (((iVar1 == 0) && (connection_time._4_4_ != IOTHUB_CREDENTIAL_TYPE_X509)) &&
                   (connection_time._4_4_ != IOTHUB_CREDENTIAL_TYPE_UNKNOWN)) {
                  l_3 = xlogging_get_log_function();
                  if (l_3 != (LOGGER_LOG)0x0) {
                    (*l_3)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"IoTHubTransport_MQTT_Common_SetOption",0xed4,1,
                           "x509privatekey specified, but authentication method is not x509");
                  }
                  l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                }
                else {
                  iVar1 = strcmp(OPTION_RETRY_INTERVAL_SEC,(char *)value_local);
                  if (iVar1 == 0) {
                    iVar1 = retry_control_set_option
                                      (pMStack_38->retry_control_handle,
                                       RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS,p_Stack_20);
                    if (iVar1 == 0) {
                      l._4_4_ = IOTHUB_CLIENT_OK;
                    }
                    else {
                      l_4 = xlogging_get_log_function();
                      if (l_4 != (LOGGER_LOG)0x0) {
                        (*l_4)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"IoTHubTransport_MQTT_Common_SetOption",0xedb,1,
                               "Failure setting retry interval option");
                      }
                      l._4_4_ = IOTHUB_CLIENT_ERROR;
                    }
                  }
                  else {
                    iVar1 = strcmp(OPTION_RETRY_MAX_DELAY_SECS,(char *)value_local);
                    if (iVar1 == 0) {
                      iVar1 = retry_control_set_option
                                        (pMStack_38->retry_control_handle,
                                         RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS,p_Stack_20);
                      if (iVar1 == 0) {
                        l._4_4_ = IOTHUB_CLIENT_OK;
                      }
                      else {
                        proxy_options = (HTTP_PROXY_OPTIONS *)xlogging_get_log_function();
                        if (proxy_options != (HTTP_PROXY_OPTIONS *)0x0) {
                          (*(code *)proxy_options)
                                    (0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                     ,"IoTHubTransport_MQTT_Common_SetOption",0xee7,1,
                                     "Failure setting retry max delay option");
                        }
                        l._4_4_ = IOTHUB_CLIENT_ERROR;
                      }
                    }
                    else {
                      iVar1 = strcmp("proxy_data",(char *)value_local);
                      if (iVar1 == 0) {
                        l_5 = p_Stack_20;
                        if (pMStack_38->xioTransport == (XIO_HANDLE)0x0) {
                          if (*(long *)p_Stack_20 == 0) {
                            l_7 = xlogging_get_log_function();
                            if (l_7 != (LOGGER_LOG)0x0) {
                              (*l_7)(AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                     ,"IoTHubTransport_MQTT_Common_SetOption",0xefa,1,
                                     "NULL host_address in proxy options");
                            }
                            l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                          }
                          else if (((*(long *)(p_Stack_20 + 0x10) == 0) ||
                                   (*(long *)(p_Stack_20 + 0x18) == 0)) &&
                                  (*(long *)(p_Stack_20 + 0x10) != *(long *)(p_Stack_20 + 0x18))) {
                            copied_proxy_hostname = (char *)xlogging_get_log_function();
                            if ((LOGGER_LOG)copied_proxy_hostname != (LOGGER_LOG)0x0) {
                              (*(code *)copied_proxy_hostname)
                                        (AZ_LOG_ERROR,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                         ,"IoTHubTransport_MQTT_Common_SetOption",0xf00,1,
                                         "Only one of username and password for proxy settings was NULL"
                                        );
                            }
                            l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
                          }
                          else {
                            copied_proxy_username = (char *)0x0;
                            copied_proxy_password = (char *)0x0;
                            l_8 = (LOGGER_LOG)0x0;
                            pMStack_38->http_proxy_port = *(uint *)(p_Stack_20 + 8);
                            iVar1 = mallocAndStrcpy_s(&copied_proxy_username,*(char **)p_Stack_20);
                            if (iVar1 == 0) {
                              if ((*(long *)(l_5 + 0x10) == 0) ||
                                 (iVar1 = mallocAndStrcpy_s(&copied_proxy_password,
                                                            *(char **)(l_5 + 0x10)), iVar1 == 0)) {
                                if ((*(long *)(l_5 + 0x18) == 0) ||
                                   (iVar1 = mallocAndStrcpy_s((char **)&l_8,*(char **)(l_5 + 0x18)),
                                   iVar1 == 0)) {
                                  freeProxyData(pMStack_38);
                                  pMStack_38->http_proxy_hostname = copied_proxy_username;
                                  pMStack_38->http_proxy_username = copied_proxy_password;
                                  pMStack_38->http_proxy_password = (char *)l_8;
                                  l._4_4_ = IOTHUB_CLIENT_OK;
                                }
                                else {
                                  if (copied_proxy_password != (char *)0x0) {
                                    free(copied_proxy_password);
                                  }
                                  free(copied_proxy_username);
                                  p_Var2 = xlogging_get_log_function();
                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                    (*p_Var2)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                              ,"IoTHubTransport_MQTT_Common_SetOption",0xf1c,1,
                                              "Cannot copy HTTP proxy password");
                                  }
                                  l._4_4_ = IOTHUB_CLIENT_ERROR;
                                }
                              }
                              else {
                                free(copied_proxy_username);
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  (*p_Var2)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                            ,"IoTHubTransport_MQTT_Common_SetOption",0xf12,1,
                                            "Cannot copy HTTP proxy username");
                                }
                                l._4_4_ = IOTHUB_CLIENT_ERROR;
                              }
                            }
                            else {
                              p_Var2 = xlogging_get_log_function();
                              if (p_Var2 != (LOGGER_LOG)0x0) {
                                (*p_Var2)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                          ,"IoTHubTransport_MQTT_Common_SetOption",0xf0c,1,
                                          "Cannot copy HTTP proxy hostname");
                              }
                              l._4_4_ = IOTHUB_CLIENT_ERROR;
                            }
                          }
                        }
                        else {
                          l_6 = xlogging_get_log_function();
                          if (l_6 != (LOGGER_LOG)0x0) {
                            (*l_6)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"IoTHubTransport_MQTT_Common_SetOption",0xef5,1,
                                   "Cannot set proxy option once the underlying IO is created");
                          }
                          l._4_4_ = IOTHUB_CLIENT_ERROR;
                        }
                      }
                      else {
                        iVar1 = strcmp(OPTION_X509_CERT,(char *)value_local);
                        if (((iVar1 == 0) ||
                            (iVar1 = strcmp(OPTION_X509_PRIVATE_KEY,(char *)value_local), iVar1 == 0
                            )) && (connection_time._4_4_ != IOTHUB_CREDENTIAL_TYPE_X509)) {
                          IoTHubClient_Auth_Set_x509_Type(pMStack_38->authorization_module,true);
                        }
                        iVar1 = CreateTransportProviderIfNecessary(pMStack_38);
                        if (iVar1 == 0) {
                          iVar1 = xio_setoption(pMStack_38->xioTransport,(char *)value_local,
                                                p_Stack_20);
                          l._4_4_ = (IOTHUB_CLIENT_RESULT)(iVar1 != 0);
                        }
                        else {
                          l._4_4_ = IOTHUB_CLIENT_ERROR;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_MQTT_Common_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, const void* value)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (handle == NULL) ||
        (option == NULL) ||
        (value == NULL)
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to IoTHubTransport_MQTT_Common_SetOption.");
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;

        IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(transport_data->authorization_module);

        if (strcmp(OPTION_LOG_TRACE, option) == 0)
        {
            transport_data->log_trace = *((bool*)value);
            mqtt_client_set_trace(transport_data->mqttClient, transport_data->log_trace, transport_data->raw_trace);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp("rawlogtrace", option) == 0)
        {
            transport_data->raw_trace = *((bool*)value);
            mqtt_client_set_trace(transport_data->mqttClient, transport_data->log_trace, transport_data->raw_trace);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_AUTO_URL_ENCODE_DECODE, option) == 0)
        {
            transport_data->auto_url_encode_decode = *((bool*)value);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_CONNECTION_TIMEOUT, option) == 0)
        {
            int* connection_time = (int*)value;
            if (*connection_time != transport_data->connect_timeout_in_sec)
            {
                transport_data->connect_timeout_in_sec = (uint16_t)(*connection_time);
            }
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_KEEP_ALIVE, option) == 0)
        {
            int* keepAliveOption = (int*)value;
            if (*keepAliveOption != transport_data->keepAliveValue)
            {
                transport_data->keepAliveValue = (uint16_t)(*keepAliveOption);
                if (transport_data->mqttClientStatus != MQTT_CLIENT_STATUS_NOT_CONNECTED)
                {
                    DisconnectFromClient(transport_data);
                }
            }
            result = IOTHUB_CLIENT_OK;
        }
        else if ((strcmp(OPTION_X509_CERT, option) == 0) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && cred_type != IOTHUB_CREDENTIAL_TYPE_UNKNOWN))
        {
            LogError("x509certificate specified, but authentication method is not x509");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else if ((strcmp(OPTION_X509_PRIVATE_KEY, option) == 0) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && cred_type != IOTHUB_CREDENTIAL_TYPE_UNKNOWN))
        {
            LogError("x509privatekey specified, but authentication method is not x509");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else if (strcmp(OPTION_RETRY_INTERVAL_SEC, option) == 0)
        {
            if (retry_control_set_option(transport_data->retry_control_handle, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry interval option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_MAX_DELAY_SECS, option) == 0)
        {
            if (retry_control_set_option(transport_data->retry_control_handle, RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry max delay option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, option) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS*)value;

            if (transport_data->xioTransport != NULL)
            {
                LogError("Cannot set proxy option once the underlying IO is created");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* copied_proxy_hostname = NULL;
                char* copied_proxy_username = NULL;
                char* copied_proxy_password = NULL;

                transport_data->http_proxy_port = proxy_options->port;
                if (mallocAndStrcpy_s(&copied_proxy_hostname, proxy_options->host_address) != 0)
                {
                    LogError("Cannot copy HTTP proxy hostname");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->username != NULL) && (mallocAndStrcpy_s(&copied_proxy_username, proxy_options->username) != 0))
                {
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->password != NULL) && (mallocAndStrcpy_s(&copied_proxy_password, proxy_options->password) != 0))
                {
                    if (copied_proxy_username != NULL)
                    {
                        free(copied_proxy_username);
                    }
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    freeProxyData(transport_data);

                    transport_data->http_proxy_hostname = copied_proxy_hostname;
                    transport_data->http_proxy_username = copied_proxy_username;
                    transport_data->http_proxy_password = copied_proxy_password;

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            if (((strcmp(OPTION_X509_CERT, option) == 0) || (strcmp(OPTION_X509_PRIVATE_KEY, option) == 0)) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509))
            {
                IoTHubClient_Auth_Set_x509_Type(transport_data->authorization_module, true);
            }

            if (CreateTransportProviderIfNecessary(transport_data) == 0)
            {
                if (xio_setoption(transport_data->xioTransport, option, value) == 0)
                {
                    result = IOTHUB_CLIENT_OK;
                }
                else
                {
                    result = IOTHUB_CLIENT_INVALID_ARG;
                }
            }
            else
            {
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }
    return result;
}